

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

int isolat1ToUTF8(uchar *out,int *outlen,uchar *in,int *inlen)

{
  bool bVar1;
  int *piVar2;
  int *piVar3;
  byte *pbVar4;
  int *local_58;
  uchar *instop;
  uchar *inend;
  uchar *outend;
  uchar *base;
  uchar *outstart;
  int *inlen_local;
  uchar *in_local;
  int *outlen_local;
  uchar *out_local;
  
  if ((((out == (uchar *)0x0) || (in == (uchar *)0x0)) || (outlen == (int *)0x0)) ||
     (inlen == (int *)0x0)) {
    out_local._4_4_ = -1;
  }
  else {
    piVar2 = (int *)(out + *outlen);
    piVar3 = (int *)(in + *inlen);
    local_58 = piVar3;
    inlen_local = (int *)in;
    outlen_local = (int *)out;
    while (inlen_local < piVar3 && outlen_local < (int *)((long)piVar2 - 1U)) {
      if (0x7f < (byte)*inlen_local) {
        pbVar4 = (byte *)((long)outlen_local + 1);
        *(byte *)outlen_local = (byte)((int)(uint)(byte)*inlen_local >> 6) | 0xc0;
        outlen_local = (int *)((long)outlen_local + 2);
        *pbVar4 = (byte)*inlen_local & 0x3f | 0x80;
        inlen_local = (int *)((long)inlen_local + 1);
      }
      if ((long)piVar2 - (long)outlen_local < (long)local_58 - (long)inlen_local) {
        local_58 = (int *)((long)inlen_local + ((long)piVar2 - (long)outlen_local));
      }
      while( true ) {
        bVar1 = false;
        if (inlen_local < local_58) {
          bVar1 = (byte)*inlen_local < 0x80;
        }
        if (!bVar1) break;
        *(char *)outlen_local = (char)*inlen_local;
        inlen_local = (int *)((long)inlen_local + 1);
        outlen_local = (int *)((long)outlen_local + 1);
      }
    }
    if (((inlen_local < piVar3) && (outlen_local < piVar2)) && ((byte)*inlen_local < 0x80)) {
      *(char *)outlen_local = (char)*inlen_local;
      inlen_local = (int *)((long)inlen_local + 1);
      outlen_local = (int *)((long)outlen_local + 1);
    }
    *outlen = (int)outlen_local - (int)out;
    *inlen = (int)inlen_local - (int)in;
    out_local._4_4_ = *outlen;
  }
  return out_local._4_4_;
}

Assistant:

int
isolat1ToUTF8(unsigned char* out, int *outlen,
              const unsigned char* in, int *inlen) {
    unsigned char* outstart = out;
    const unsigned char* base = in;
    unsigned char* outend;
    const unsigned char* inend;
    const unsigned char* instop;

    if ((out == NULL) || (in == NULL) || (outlen == NULL) || (inlen == NULL))
	return(-1);

    outend = out + *outlen;
    inend = in + (*inlen);
    instop = inend;

    while ((in < inend) && (out < outend - 1)) {
	if (*in >= 0x80) {
	    *out++ = (((*in) >>  6) & 0x1F) | 0xC0;
            *out++ = ((*in) & 0x3F) | 0x80;
	    ++in;
	}
	if ((instop - in) > (outend - out)) instop = in + (outend - out);
	while ((in < instop) && (*in < 0x80)) {
	    *out++ = *in++;
	}
    }
    if ((in < inend) && (out < outend) && (*in < 0x80)) {
        *out++ = *in++;
    }
    *outlen = out - outstart;
    *inlen = in - base;
    return(*outlen);
}